

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O1

size_t __thiscall proto2_unittest::ComplexOptionType2::ByteSizeLong(ComplexOptionType2 *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  Rep *pRVar7;
  size_t sVar8;
  ulong uVar9;
  RepeatedPtrField<proto2_unittest::ComplexOptionType2_ComplexOptionType4> *this_00;
  RepeatedPtrField<proto2_unittest::ComplexOptionType2_ComplexOptionType4> *pRVar10;
  
  sVar6 = google::protobuf::internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  iVar1 = *(int *)((long)&this->field_0 + 0x28);
  this_00 = &(this->field_0)._impl_.barney_;
  pRVar10 = this_00;
  if ((*(byte *)((long)&this->field_0 + 0x20) & 1) != 0) {
    pRVar7 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&this_00->super_RepeatedPtrFieldBase);
    pRVar10 = (RepeatedPtrField<proto2_unittest::ComplexOptionType2_ComplexOptionType4> *)
              pRVar7->elements;
  }
  if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
    pRVar7 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                       (&this_00->super_RepeatedPtrFieldBase);
    this_00 = (RepeatedPtrField<proto2_unittest::ComplexOptionType2_ComplexOptionType4> *)
              pRVar7->elements;
  }
  sVar6 = sVar6 + (long)iVar1;
  iVar1 = *(int *)((long)&this->field_0 + 0x28);
  for (; pRVar10 !=
         (RepeatedPtrField<proto2_unittest::ComplexOptionType2_ComplexOptionType4> *)
         (&(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar10 = (RepeatedPtrField<proto2_unittest::ComplexOptionType2_ComplexOptionType4> *)
                &(pRVar10->super_RepeatedPtrFieldBase).current_size_) {
    sVar8 = ComplexOptionType2_ComplexOptionType4::ByteSizeLong
                      ((ComplexOptionType2_ComplexOptionType4 *)
                       (pRVar10->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar4 = (uint)sVar8 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar6 = sVar6 + sVar8 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  uVar4 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar4 & 7) != 0) {
    if ((uVar4 & 1) != 0) {
      sVar8 = ComplexOptionType1::ByteSizeLong((this->field_0)._impl_.bar_);
      uVar5 = (uint)sVar8 | 1;
      iVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar6 = sVar6 + sVar8 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar4 & 2) != 0) {
      sVar8 = ComplexOptionType2_ComplexOptionType4::ByteSizeLong((this->field_0)._impl_.fred_);
      uVar5 = (uint)sVar8 | 1;
      iVar1 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar6 = sVar6 + sVar8 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar4 & 4) != 0) {
      uVar9 = (long)(this->field_0)._impl_.baz_ | 1;
      lVar3 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      sVar6 = sVar6 + ((int)lVar3 * 9 + 0x89U >> 6);
    }
  }
  sVar6 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar6,&(this->field_0)._impl_._cached_size_);
  return sVar6;
}

Assistant:

::size_t ComplexOptionType2::ByteSizeLong() const {
  const ComplexOptionType2& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.ComplexOptionType2)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .proto2_unittest.ComplexOptionType2.ComplexOptionType4 barney = 4;
    {
      total_size += 1UL * this_._internal_barney_size();
      for (const auto& msg : this_._internal_barney()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    // optional .proto2_unittest.ComplexOptionType1 bar = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.bar_);
    }
    // optional .proto2_unittest.ComplexOptionType2.ComplexOptionType4 fred = 3;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.fred_);
    }
    // optional int32 baz = 2;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_baz());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}